

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O0

bool Js::JavascriptStackWalker::ValidateTopJitFrame(ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  InterpreterStackFrame *pIVar5;
  JavascriptFunction *local_c8;
  JavascriptFunction *function;
  JavascriptStackWalker walker;
  ScriptContext *scriptContext_local;
  
  if ((DAT_01e9e22e & 1) != 0) {
    walker.currentFrame.stackCheckCodeHeight = (size_t)scriptContext;
    JavascriptStackWalker((JavascriptStackWalker *)&function,scriptContext,true,(PVOID)0x0,false);
    do {
      BVar3 = GetCaller((JavascriptStackWalker *)&function,&local_c8,true);
      if (BVar3 == 0) break;
      if (local_c8 == (JavascriptFunction *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                    ,0x641,"(function)","function");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      pIVar5 = GetCurrentInterpreterFrame((JavascriptStackWalker *)&function);
    } while (pIVar5 == (InterpreterStackFrame *)0x0);
    ~JavascriptStackWalker((JavascriptStackWalker *)&function);
  }
  return true;
}

Assistant:

bool JavascriptStackWalker::ValidateTopJitFrame(Js::ScriptContext* scriptContext)
    {
        if (!Configuration::Global.flags.ValidateInlineStack)
        {
            return true;
        }
        Js::JavascriptStackWalker walker(scriptContext);
        Js::JavascriptFunction* function;
        while (walker.GetCaller(&function))
        {
            Assert(function);
            if (walker.GetCurrentInterpreterFrame() != nullptr)
            {
                break;
            }
        }
        // If no asserts have fired yet - we should have succeeded.
        return true;
    }